

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O1

string * __thiscall
fmt::v5::format<unsigned_short,unsigned_short,unsigned_short>
          (string *__return_storage_ptr__,v5 *this,string_view format_str,unsigned_short *args,
          unsigned_short *args_1,unsigned_short *args_2)

{
  basic_string_view<char> format_str_00;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_00;
  format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_unsigned_short,_unsigned_short,_unsigned_short>
  as;
  ulong local_268 [2];
  ulong local_258;
  ulong local_248;
  undefined **local_230;
  undefined1 *local_228;
  long lStack_220;
  ulong local_218;
  undefined1 local_210 [504];
  
  format_str_00.size_ = format_str.data_;
  local_268[0] = (ulong)*(ushort *)format_str.size_;
  local_258 = (ulong)*args;
  local_248 = (ulong)*args_1;
  lStack_220 = 0;
  local_230 = &PTR_grow_0019d320;
  local_218 = 500;
  format_str_00.data_ = (char *)this;
  args_00.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)local_268;
  args_00.types_ = 0x333;
  local_228 = local_210;
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_230,format_str_00,args_00);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,local_228,local_228 + lStack_220);
  local_230 = &PTR_grow_0019d320;
  if (local_228 != local_210) {
    operator_delete(local_228,local_218);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string format(string_view format_str, const Args & ... args) {
  // This should be just
  // return vformat(format_str, make_format_args(args...));
  // but gcc has trouble optimizing the latter, so break it down.
  format_arg_store<format_context, Args...> as{args...};
  return vformat(format_str, as);
}